

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O2

void mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm
               (MPI_Comm cart_comm,int ndims,int *stencil,int num_neighbors,int *dims,int *periods,
               MPI_Comm *dist_graph_comm)

{
  long lVar1;
  pointer piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 auStackY_90 [3];
  int *local_68;
  int *local_60;
  _Vector_base<int,_std::allocator<int>_> local_58;
  int local_38;
  int local_34;
  int cart_rank;
  int real_neighbors_size;
  
  local_68 = periods;
  local_60 = dims;
  MPI_Comm_rank(cart_comm,&local_38);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStackY_90[2] = 0x14d126;
  get_neighbors_from_stencil
            (cart_comm,local_38,ndims,stencil,num_neighbors,local_60,local_68,
             (vector<int,_std::allocator<int>_> *)&local_58);
  uVar4 = (ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58._M_impl.super__Vector_impl_data._M_start) >> 2;
  iVar3 = (int)uVar4;
  lVar1 = -(((long)local_58._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58._M_impl.super__Vector_impl_data._M_start & 0x3fffffffcU) + 0xf &
           0xfffffffffffffff0);
  uVar5 = 0;
  uVar6 = 0;
  local_34 = iVar3;
  if (0 < iVar3) {
    uVar6 = uVar4 & 0xffffffff;
  }
  for (; piVar2 = local_58._M_impl.super__Vector_impl_data._M_start, uVar6 != uVar5;
      uVar5 = uVar5 + 1) {
    *(undefined4 *)((long)&local_68 + uVar5 * 4 + lVar1) = 0;
  }
  *(MPI_Comm **)(&stack0xffffffffffffff88 + lVar1) = dist_graph_comm;
  *(undefined8 *)((long)auStackY_90 + lVar1 + 0x10) = 0;
  *(undefined **)((long)auStackY_90 + lVar1 + 8) = &ompi_mpi_info_null;
  *(undefined8 *)((long)auStackY_90 + lVar1) = 0x14d1a3;
  MPI_Dist_graph_create(cart_comm,iVar3 != 0,&local_38,&local_34,piVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm(MPI_Comm cart_comm, const int ndims,
															 const int stencil[],
															 const int num_neighbors,
															 const int dims[],
															 const int periods[],
															 MPI_Comm *dist_graph_comm) {

  int cart_rank;
  MPI_Comm_rank(cart_comm, &cart_rank);
  std::vector<int> real_neighbors{};
  mpireorderinglib::get_neighbors_from_stencil(cart_comm, cart_rank,
											   ndims, stencil, num_neighbors, dims,
											   periods, real_neighbors);

  int real_neighbors_size = real_neighbors.size();
  int weights[real_neighbors_size];
  for (int i{0}; i < real_neighbors_size; i++) weights[i] = 0;

  int n_vertices_to_specify{0};
  if (real_neighbors_size) n_vertices_to_specify = 1;

  MPI_Dist_graph_create(cart_comm,
						n_vertices_to_specify,
						&cart_rank,
						&real_neighbors_size,
						real_neighbors.data(),
						weights,
						MPI_INFO_NULL,
						0,
						dist_graph_comm);
}